

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec)

{
  uint *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int *piVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  int iVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_168;
  ulong local_128;
  ulong local_120;
  cpp_dec_float<50U,_int,_void> local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  int *local_a0;
  pointer local_98;
  int *local_90;
  int *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_78;
  ulong local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_118.fpclass = cpp_dec_float_finite;
  local_118.prec_elem = 10;
  local_118.data._M_elems[0] = 0;
  local_118.data._M_elems[1] = 0;
  local_118.data._M_elems[2] = 0;
  local_118.data._M_elems[3] = 0;
  local_118.data._M_elems[4] = 0;
  local_118.data._M_elems[5] = 0;
  local_118.data._M_elems._24_5_ = 0;
  local_118.data._M_elems[7]._1_3_ = 0;
  local_118.data._M_elems._32_5_ = 0;
  local_118.data._M_elems[9]._1_3_ = 0;
  local_118.exp = 0;
  local_118.neg = false;
  local_98 = (this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (this->l).idx;
  local_88 = (this->l).row;
  local_90 = (this->l).start;
  local_70 = (ulong)(this->l).firstUpdate;
  if ((long)local_70 < 1) {
    local_128 = 0;
  }
  else {
    local_128 = 0;
    local_80 = vec;
    local_78 = this;
    do {
      iVar5 = local_88[local_128];
      uVar3 = *(undefined8 *)(vec[iVar5].m_backend.data._M_elems + 8);
      local_118.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_118.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_118.data._M_elems._0_8_ = *(undefined8 *)vec[iVar5].m_backend.data._M_elems;
      local_118.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar5].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar5].m_backend.data._M_elems + 4;
      local_118.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_118.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_118.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_118.exp = vec[iVar5].m_backend.exp;
      local_118.neg = vec[iVar5].m_backend.neg;
      local_118.fpclass = vec[iVar5].m_backend.fpclass;
      local_118.prec_elem = vec[iVar5].m_backend.prec_elem;
      if (local_118.fpclass == cpp_dec_float_NaN) {
LAB_002853fa:
        local_120 = (ulong)local_90[local_128];
        iVar5 = local_90[local_128 + 1];
        if (local_90[local_128] < iVar5) {
          pcVar9 = &local_98[local_120].m_backend;
          piVar6 = local_a0 + local_120;
          do {
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems[6] = 0;
            local_168.data._M_elems[7] = 0;
            local_168.data._M_elems[8] = 0;
            local_168.data._M_elems[9] = 0;
            local_168.exp = 0;
            local_168.neg = false;
            pcVar7 = &local_118;
            if (pcVar9 != &local_168) {
              local_168.data._M_elems[8] = local_118.data._M_elems[8];
              local_168.data._M_elems[9] =
                   (uint)(CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_)
                         >> 0x20);
              local_168.data._M_elems[4] = local_118.data._M_elems[4];
              local_168.data._M_elems[5] = local_118.data._M_elems[5];
              local_168.data._M_elems[6] = local_118.data._M_elems[6];
              local_168.data._M_elems[7] =
                   (uint)(CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_)
                         >> 0x20);
              local_168.data._M_elems[0] = local_118.data._M_elems[0];
              local_168.data._M_elems[1] = local_118.data._M_elems[1];
              local_168.data._M_elems[2] = local_118.data._M_elems[2];
              local_168.data._M_elems[3] = local_118.data._M_elems[3];
              local_168.exp = local_118.exp;
              local_168.neg = local_118.neg;
              local_168.fpclass = local_118.fpclass;
              local_168.prec_elem = local_118.prec_elem;
              pcVar7 = pcVar9;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_168,pcVar7);
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68.data._M_elems[9]._1_3_ = 0;
            local_68.exp = 0;
            local_68.neg = false;
            pcVar7 = &local_118;
            if (pcVar9 != &local_68) {
              local_68.data._M_elems._32_5_ = local_118.data._M_elems._32_5_;
              local_68.data._M_elems[9]._1_3_ = local_118.data._M_elems[9]._1_3_;
              local_68.data._M_elems[4] = local_118.data._M_elems[4];
              local_68.data._M_elems[5] = local_118.data._M_elems[5];
              local_68.data._M_elems._24_5_ = local_118.data._M_elems._24_5_;
              local_68.data._M_elems[7]._1_3_ = local_118.data._M_elems[7]._1_3_;
              local_68.data._M_elems[0] = local_118.data._M_elems[0];
              local_68.data._M_elems[1] = local_118.data._M_elems[1];
              local_68.data._M_elems[2] = local_118.data._M_elems[2];
              local_68.data._M_elems[3] = local_118.data._M_elems[3];
              local_68.exp = local_118.exp;
              local_68.neg = local_118.neg;
              local_68.fpclass = local_118.fpclass;
              local_68.prec_elem = local_118.prec_elem;
              pcVar7 = pcVar9;
            }
            pcVar10 = &local_80[*piVar6].m_backend;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_68,pcVar7);
            local_d8.fpclass = cpp_dec_float_finite;
            local_d8.prec_elem = 10;
            local_d8.data._M_elems[0] = 0;
            local_d8.data._M_elems[1] = 0;
            local_d8.data._M_elems[2] = 0;
            local_d8.data._M_elems[3] = 0;
            local_d8.data._M_elems[4] = 0;
            local_d8.data._M_elems[5] = 0;
            local_d8.data._M_elems._24_5_ = 0;
            local_d8.data._M_elems[7]._1_3_ = 0;
            local_d8.data._M_elems._32_5_ = 0;
            local_d8.data._M_elems[9]._1_3_ = 0;
            local_d8.exp = 0;
            local_d8.neg = false;
            if (&local_d8 != pcVar10) {
              uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
              local_d8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
              local_d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
              local_d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
              local_d8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_d8.exp = *(int *)(&pcVar10->data + 1);
              local_d8.neg = *(bool *)((long)(&pcVar10->data + 1) + 4);
              local_d8._48_8_ = *(undefined8 *)((long)(&pcVar10->data + 1) + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_d8,&local_68);
            local_168.fpclass = cpp_dec_float_finite;
            local_168.prec_elem = 10;
            local_168.data._M_elems[0] = 0;
            local_168.data._M_elems[1] = 0;
            local_168.data._M_elems[2] = 0;
            local_168.data._M_elems[3] = 0;
            local_168.data._M_elems[4] = 0;
            local_168.data._M_elems[5] = 0;
            local_168.data._M_elems[6] = 0;
            local_168.data._M_elems[7] = 0;
            local_168.data._M_elems[8] = 0;
            local_168.data._M_elems[9] = 0;
            local_168.exp = 0;
            local_168.neg = false;
            pcVar7 = &local_118;
            if (pcVar9 != &local_168) {
              local_168.data._M_elems[8] = local_118.data._M_elems[8];
              local_168.data._M_elems[9] =
                   (uint)(CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_)
                         >> 0x20);
              local_168.data._M_elems[4] = local_118.data._M_elems[4];
              local_168.data._M_elems[5] = local_118.data._M_elems[5];
              local_168.data._M_elems[6] = local_118.data._M_elems[6];
              local_168.data._M_elems[7] =
                   (uint)(CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_)
                         >> 0x20);
              local_168.data._M_elems[0] = local_118.data._M_elems[0];
              local_168.data._M_elems[1] = local_118.data._M_elems[1];
              local_168.data._M_elems[2] = local_118.data._M_elems[2];
              local_168.data._M_elems[3] = local_118.data._M_elems[3];
              local_168.exp = local_118.exp;
              local_168.neg = local_118.neg;
              local_168.fpclass = local_118.fpclass;
              local_168.prec_elem = local_118.prec_elem;
              pcVar7 = pcVar9;
            }
            pcVar9 = pcVar9 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_168,pcVar7);
            vec = local_80;
            iVar8 = *piVar6;
            piVar6 = piVar6 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_80[iVar8].m_backend,&local_168);
            iVar5 = iVar5 + -1;
          } while ((int)local_120 < iVar5);
        }
      }
      else {
        local_168.fpclass = cpp_dec_float_finite;
        local_168.prec_elem = 10;
        local_168.data._M_elems[0] = 0;
        local_168.data._M_elems[1] = 0;
        local_168.data._M_elems[2] = 0;
        local_168.data._M_elems[3] = 0;
        local_168.data._M_elems[4] = 0;
        local_168.data._M_elems[5] = 0;
        local_168.data._M_elems[6] = 0;
        local_168.data._M_elems[7] = 0;
        local_168.data._M_elems[8] = 0;
        local_168.data._M_elems[9] = 0;
        local_168.exp = 0;
        local_168.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_168,0.0);
        iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_118,&local_168);
        if (iVar5 != 0) goto LAB_002853fa;
      }
      local_128 = local_128 + 1;
      this = local_78;
    } while (local_128 != local_70);
  }
  if (((this->l).updateType != 0) && (uVar2 = (this->l).firstUnused, (int)local_128 < (int)uVar2)) {
    local_120 = local_128 & 0xffffffff;
    local_128 = (ulong)uVar2;
    do {
      iVar5 = local_90[local_120];
      iVar8 = local_88[local_120];
      local_168.data._M_elems[0] = vec[iVar8].m_backend.data._M_elems[0];
      local_168.data._M_elems[9] = vec[iVar8].m_backend.data._M_elems[9];
      puVar1 = vec[iVar8].m_backend.data._M_elems + 5;
      uVar3 = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_168.data._M_elems[5] = (uint)uVar3;
      local_168.data._M_elems[6] = (uint)((ulong)uVar3 >> 0x20);
      local_168.data._M_elems[7] = (uint)uVar4;
      local_168.data._M_elems[8] = (uint)((ulong)uVar4 >> 0x20);
      puVar1 = vec[iVar8].m_backend.data._M_elems + 1;
      uVar3 = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_168.data._M_elems[1] = (uint)uVar3;
      local_168.data._M_elems[2] = (uint)((ulong)uVar3 >> 0x20);
      local_168.data._M_elems[3] = (uint)uVar4;
      local_168.data._M_elems[4] = (uint)((ulong)uVar4 >> 0x20);
      local_168.exp = vec[iVar8].m_backend.exp;
      local_168.fpclass = vec[iVar8].m_backend.fpclass;
      local_168.prec_elem = vec[iVar8].m_backend.prec_elem;
      local_168.neg =
           (bool)((local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) ^
                 vec[iVar8].m_backend.neg);
      iVar8 = local_90[local_120 + 1];
      if (iVar5 < iVar8) {
        pcVar9 = &local_98[iVar5].m_backend;
        piVar6 = local_a0 + iVar5;
        do {
          pcVar10 = &vec[*piVar6].m_backend;
          local_d8.fpclass = cpp_dec_float_finite;
          local_d8.prec_elem = 10;
          local_d8.data._M_elems[0] = 0;
          local_d8.data._M_elems[1] = 0;
          local_d8.data._M_elems[2] = 0;
          local_d8.data._M_elems[3] = 0;
          local_d8.data._M_elems[4] = 0;
          local_d8.data._M_elems[5] = 0;
          local_d8.data._M_elems._24_5_ = 0;
          local_d8.data._M_elems[7]._1_3_ = 0;
          local_d8.data._M_elems._32_5_ = 0;
          local_d8.data._M_elems[9]._1_3_ = 0;
          local_d8.exp = 0;
          local_d8.neg = false;
          pcVar7 = pcVar10;
          if ((pcVar9 != &local_d8) && (pcVar7 = pcVar9, &local_d8 != pcVar10)) {
            uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
            local_d8.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
            local_d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
            local_d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
            local_d8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_d8.exp = pcVar10->exp;
            local_d8.neg = pcVar10->neg;
            local_d8.fpclass = pcVar10->fpclass;
            local_d8.prec_elem = pcVar10->prec_elem;
          }
          piVar6 = piVar6 + 1;
          pcVar9 = pcVar9 + 1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_d8,pcVar7);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_168,&local_d8);
          iVar8 = iVar8 + -1;
        } while (iVar5 < iVar8);
      }
      iVar5 = local_88[local_120];
      local_120 = local_120 + 1;
      vec[iVar5].m_backend.data._M_elems[0] = local_168.data._M_elems[0];
      puVar1 = vec[iVar5].m_backend.data._M_elems + 1;
      *(ulong *)puVar1 = CONCAT44(local_168.data._M_elems[2],local_168.data._M_elems[1]);
      *(ulong *)(puVar1 + 2) = CONCAT44(local_168.data._M_elems[4],local_168.data._M_elems[3]);
      puVar1 = vec[iVar5].m_backend.data._M_elems + 5;
      *(ulong *)puVar1 = CONCAT44(local_168.data._M_elems[6],local_168.data._M_elems[5]);
      *(ulong *)(puVar1 + 2) = CONCAT44(local_168.data._M_elems[8],local_168.data._M_elems[7]);
      vec[iVar5].m_backend.data._M_elems[9] = local_168.data._M_elems[9];
      vec[iVar5].m_backend.exp = local_168.exp;
      vec[iVar5].m_backend.neg =
           (bool)((local_168.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite) ^
                 local_168.neg);
      vec[iVar5].m_backend.fpclass = local_168.fpclass;
      vec[iVar5].m_backend.prec_elem = local_168.prec_elem;
    } while (local_120 != local_128);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLright(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);

         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            SPxOut::debug(this, "                         -> y{} -= {} * {} = {}    -> {}\n", *idx, x, *val,
                          x * (*val), vec[*idx] - x * (*val));
            vec[*idx++] -= x * (*val++);
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      SPxOut::debug(this, "performing FT updates...\n");

      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);
         StableSum<R> tmp(-vec[lrow[i]]);

         for(j = lbeg[i + 1]; j > k; --j)
            tmp += vec[*idx++] * (*val++);

         vec[lrow[i]] = -R(tmp);

         SPxOut::debug(this, "y{}={}\n", lrow[i], vec[lrow[i]]);
      }

      SPxOut::debug(this, "finished FT updates.\n");
   }
}